

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
DataFilters::addStringFilter
          (DataFilters *this,uint *index,string *pattern,bool *isExact,bool *isSensitive,
          bool *isAccept)

{
  uint uVar1;
  StringFilter SStack_78;
  StringFilterCase local_50;
  
  uVar1 = *index;
  StringFilter::StringFilter(&SStack_78,pattern,isExact,isSensitive,isAccept);
  local_50.index = uVar1;
  StringFilter::StringFilter(&local_50.filter,&SStack_78);
  std::vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>::
  emplace_back<DataFilters::StringFilterCase>(&this->_stringFilters,&local_50);
  std::__cxx11::string::~string((string *)&local_50.filter);
  std::__cxx11::string::~string((string *)&SStack_78);
  return;
}

Assistant:

void
    addStringFilter(unsigned int const & index,
                    std::string const & pattern,
                    bool const & isExact,
                    bool const & isSensitive,
                    bool const & isAccept)
    {
        this->_stringFilters.push_back(StringFilterCase(index, StringFilter(pattern, isExact, isSensitive, isAccept)));
    }